

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

void __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::LockFreeQueue
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,usize capacity)

{
  Node *pNVar1;
  ulong local_20;
  usize i;
  usize capacity_local;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_local;
  
  this->_capacityMask = capacity - 1;
  this->_capacityMask = this->_capacityMask >> 1 | this->_capacityMask;
  this->_capacityMask = this->_capacityMask >> 2 | this->_capacityMask;
  this->_capacityMask = this->_capacityMask >> 4 | this->_capacityMask;
  this->_capacityMask = this->_capacityMask >> 8 | this->_capacityMask;
  this->_capacityMask = this->_capacityMask >> 0x10 | this->_capacityMask;
  this->_capacity = this->_capacityMask + 1;
  pNVar1 = (Node *)operator_new__(this->_capacity << 5);
  this->_queue = pNVar1;
  for (local_20 = 0; local_20 < this->_capacity; local_20 = local_20 + 1) {
    this->_queue[local_20].tail = local_20;
    this->_queue[local_20].head = 0xffffffffffffffff;
  }
  this->_tail = 0;
  this->_head = 0;
  return;
}

Assistant:

inline Future<void>::Private::LockFreeQueue<T>::LockFreeQueue(usize capacity)
{
  _capacityMask = capacity - 1;
  _capacityMask |= _capacityMask >> 1;
  _capacityMask |= _capacityMask >> 2;
  _capacityMask |= _capacityMask >> 4;
  _capacityMask |= _capacityMask >> 8;
  _capacityMask |= _capacityMask >> 16;
  _capacity = _capacityMask + 1;

  _queue = (Node *)new char[sizeof(Node) * _capacity];
  for (usize i = 0; i < _capacity; ++i)
  {
    _queue[i].tail = i;
    _queue[i].head = -1;
  }

  _tail = 0;
  _head = 0;
}